

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O1

void composition_solid_destination_over
               (uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (const_alpha != 0xff) {
    uVar1 = (color & 0xff00ff) * const_alpha;
    uVar2 = (color >> 8 & 0xff00ff) * const_alpha;
    color = uVar2 + 0x800080 + (uVar2 >> 8 & 0xff00ff) & 0xff00ff00 |
            uVar1 + 0x800080 + (uVar1 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
  }
  if (0 < length) {
    uVar3 = 0;
    do {
      uVar2 = ~dest[uVar3] >> 0x18;
      uVar1 = uVar2 * (color & 0xff00ff);
      uVar2 = uVar2 * (color >> 8 & 0xff00ff);
      dest[uVar3] = (uVar2 + 0x800080 + (uVar2 >> 8 & 0xff00ff) & 0xff00ff00) + dest[uVar3] +
                    (uVar1 + 0x800080 + (uVar1 >> 8 & 0xff00ff) >> 8 & 0xff00ff);
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
  }
  return;
}

Assistant:

static void composition_solid_destination_over(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    for(int i = 0; i < length; i++) {
        uint32_t d = dest[i];
        dest[i] = d + BYTE_MUL(color, plutovg_alpha(~d));
    }
}